

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishNamedPoint(HelicsPublication pub,char *str,double val,HelicsError *err)

{
  string_view field;
  string_view field_00;
  PublicationObject *pPVar1;
  long in_RSI;
  PublicationObject *pubObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffff78,(HelicsError *)in_stack_ffffffffffffff70);
  if (pPVar1 != (PublicationObject *)0x0) {
    if (in_RSI == 0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar1->pubPtr
                );
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff70);
      field._M_str = (char *)pub;
      field._M_len = (size_t)str;
      helics::Publication::publish((Publication *)val,field,(double)err);
      std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      field_00._M_str = (char *)pub;
      field_00._M_len = (size_t)str;
      helics::Publication::publish((Publication *)val,field_00,(double)err);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishNamedPoint(HelicsPublication pub, const char* str, double val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if (str == nullptr) {
            pubObj->pubPtr->publish(std::string(), val);
        } else {
            pubObj->pubPtr->publish(str, val);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}